

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua.c
# Opt level: O3

void doREPL(lua_State *L)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  size_t size;
  size_t local_48;
  char *local_40;
  ulong local_38;
  
  local_40 = progname;
  progname = (char *)0x0;
  _rl_readline_name = "lua";
  lua_settop(L,0);
  iVar1 = pushline(L,1);
  if (iVar1 != 0) {
    do {
      pcVar2 = lua_tolstring(L,-1,(size_t *)0x0);
      pcVar3 = lua_pushfstring(L,"return %s;",pcVar2);
      size = strlen(pcVar3);
      iVar1 = luaL_loadbufferx(L,pcVar3,size,"=stdin",(char *)0x0);
      if (iVar1 == 0) {
        lua_rotate(L,-2,-1);
        lua_settop(L,-2);
        if (*pcVar2 != '\0') {
          add_history(pcVar2);
        }
        lua_rotate(L,1,-1);
        lua_settop(L,-2);
LAB_001067b1:
        iVar1 = docall(L,0,-1);
        if (iVar1 != 0) goto LAB_00106863;
        iVar1 = lua_gettop(L);
        if (0 < iVar1) {
          luaL_checkstack(L,0x14,"too many results to print");
          lua_getglobal(L,"print");
          lua_rotate(L,1,1);
          iVar1 = lua_pcallk(L,iVar1,0,0,0,(lua_KFunction)0x0);
          if (iVar1 != 0) {
            doREPL_cold_1();
          }
        }
      }
      else {
        lua_settop(L,-3);
        while( true ) {
          pcVar2 = lua_tolstring(L,1,&local_48);
          iVar1 = luaL_loadbufferx(L,pcVar2,local_48,"=stdin",(char *)0x0);
          if (iVar1 != 3) break;
          pcVar3 = lua_tolstring(L,-1,&local_38);
          if ((local_38 < 5) || (iVar1 = strcmp(pcVar3 + (local_38 - 5),"<eof>"), iVar1 != 0)) {
LAB_00106836:
            add_history(pcVar2);
            lua_rotate(L,1,-1);
            lua_settop(L,-2);
            iVar1 = 3;
            goto LAB_00106863;
          }
          lua_settop(L,-2);
          iVar1 = pushline(L,0);
          if (iVar1 == 0) goto LAB_00106836;
          lua_pushstring(L,anon_var_dwarf_aa62 + 5);
          lua_rotate(L,-2,1);
          lua_concat(L,3);
        }
        add_history(pcVar2);
        lua_rotate(L,1,-1);
        lua_settop(L,-2);
        if (iVar1 == 0) goto LAB_001067b1;
        if (iVar1 == -1) break;
LAB_00106863:
        report(L,iVar1);
      }
      lua_settop(L,0);
      iVar1 = pushline(L,1);
    } while (iVar1 != 0);
  }
  lua_settop(L,0);
  fputc(10,_stdout);
  fflush(_stdout);
  progname = local_40;
  return;
}

Assistant:

static void doREPL (lua_State *L) {
  int status;
  const char *oldprogname = progname;
  progname = NULL;  /* no 'progname' on errors in interactive mode */
  lua_initreadline(L);
  while ((status = loadline(L)) != -1) {
    if (status == LUA_OK)
      status = docall(L, 0, LUA_MULTRET);
    if (status == LUA_OK) l_print(L);
    else report(L, status);
  }
  lua_settop(L, 0);  /* clear stack */
  lua_writeline();
  progname = oldprogname;
}